

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O3

slReturn ubxEnableNMEAMsg(int fdPort,int verbosity,nmeaMSG messageID,_Bool enable)

{
  ubxMsg msg;
  errInfo error;
  ubxMsg msg_00;
  _Bool _Var1;
  ubxChecksum uVar2;
  slBuffer *buffer;
  slReturn pvVar3;
  ubxMsg nmeaMsg;
  undefined6 uStack_56;
  slBuffer *psVar4;
  undefined2 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffba;
  slReturn in_stack_ffffffffffffffc0;
  char *pcStack_38;
  char *local_30;
  undefined8 uStack_28;
  
  buffer = create_slBuffer(8,LittleEndian);
  put_uint8_slBuffer(buffer,0,0xf0);
  put_uint8_slBuffer(buffer,1,(uint8_t)messageID);
  put_uint8_slBuffer(buffer,2,'\0');
  put_uint8_slBuffer(buffer,3,enable);
  put_uint8_slBuffer(buffer,4,'\0');
  put_uint8_slBuffer(buffer,5,'\0');
  put_uint8_slBuffer(buffer,6,'\0');
  put_uint8_slBuffer(buffer,7,'\0');
  msg_00.body._0_2_ = in_stack_ffffffffffffffb8;
  msg_00._0_8_ = buffer;
  msg_00.body._2_6_ = in_stack_ffffffffffffffba;
  msg_00._16_8_ = in_stack_ffffffffffffffc0;
  psVar4 = buffer;
  uVar2 = calcFletcherChecksum(msg_00);
  msg._18_6_ = in_stack_ffffffffffffffba;
  msg.checksum = uVar2;
  msg._2_6_ = uStack_56;
  msg.type.class = '\x06';
  msg.type.id = '\x01';
  msg.body = psVar4;
  pvVar3 = sendUbxAckedMsg(fdPort,msg);
  _Var1 = isErrorReturn(pvVar3);
  if (_Var1) {
    createErrorInfo((errorInfo_slReturn *)&stack0xffffffffffffffc0,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxEnableNMEAMsg",0x197,pvVar3);
    error.fileName = pcStack_38;
    error.cause = in_stack_ffffffffffffffc0;
    error.functionName = local_30;
    error._24_8_ = uStack_28;
    pvVar3 = makeErrorMsgReturn(error,"failed to enable /disable NMEA MSG");
    return pvVar3;
  }
  free(buffer);
  pvVar3 = makeOkReturn();
  return pvVar3;
}

Assistant:

extern slReturn ubxEnableNMEAMsg(int fdPort, int verbosity, nmeaMSG messageID, bool enable) {
    // construct the configuration message...
    slBuffer* body = create_slBuffer(8, LittleEndian);

    put_uint8_slBuffer(body,  0, 0xf0);             //  Message type NMEA
    put_uint8_slBuffer(body,  1, messageID);
    put_uint8_slBuffer(body,  2, 0x00);             //  other ports
    put_uint8_slBuffer(body,  3, (enable) ? 1 : 0); //  Serial port
    put_uint8_slBuffer(body,  4, 0x00);             //  other ports
    put_uint8_slBuffer(body,  5, 0x00);             //  other ports
    put_uint8_slBuffer(body,  6, 0x00);             //  other ports
    put_uint8_slBuffer(body,  7, 0x00);             //  other ports
    ubxMsg nmeaMsg = createUbxMsg(ut_CFG_MSG, body);

    // now send it, and wait for our ack...
    slReturn nmeaResp = sendUbxAckedMsg(fdPort, nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "failed to enable /disable NMEA MSG");

    free(body);

    return makeOkReturn();
}